

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_truetype.h
# Opt level: O0

int stbtt_PackFontRange(stbtt_pack_context *spc,uchar *fontdata,int font_index,float font_size,
                       int first_unicode_codepoint_in_range,int num_chars_in_range,
                       stbtt_packedchar *chardata_for_range)

{
  int iVar1;
  undefined1 local_58 [8];
  stbtt_pack_range range;
  stbtt_packedchar *chardata_for_range_local;
  int num_chars_in_range_local;
  int first_unicode_codepoint_in_range_local;
  float font_size_local;
  int font_index_local;
  uchar *fontdata_local;
  stbtt_pack_context *spc_local;
  
  range.font_size = 0.0;
  range.first_unicode_codepoint_in_range = 0;
  local_58._0_4_ = font_size;
  local_58._4_4_ = first_unicode_codepoint_in_range;
  range.array_of_unicode_codepoints._0_4_ = num_chars_in_range;
  range._16_8_ = chardata_for_range;
  range._32_8_ = chardata_for_range;
  iVar1 = stbtt_PackFontRanges(spc,fontdata,font_index,(stbtt_pack_range *)local_58,1);
  return iVar1;
}

Assistant:

STBTT_DEF int stbtt_PackFontRange(stbtt_pack_context *spc, const unsigned char *fontdata, int font_index, float font_size,
            int first_unicode_codepoint_in_range, int num_chars_in_range, stbtt_packedchar *chardata_for_range)
{
   stbtt_pack_range range;
   range.first_unicode_codepoint_in_range = first_unicode_codepoint_in_range;
   range.array_of_unicode_codepoints = NULL;
   range.num_chars                   = num_chars_in_range;
   range.chardata_for_range          = chardata_for_range;
   range.font_size                   = font_size;
   return stbtt_PackFontRanges(spc, fontdata, font_index, &range, 1);
}